

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O2

void __thiscall
rangeless::tsv::to_num::throw_if<unsigned_int>(to_num *this,bool cond,uint *param_2,char *message)

{
  domain_error *this_00;
  undefined7 in_register_00000031;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((int)CONCAT71(in_register_00000031,cond) == 0) {
    return;
  }
  this_00 = (domain_error *)__cxa_allocate_exception(0x10);
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,this->m_beg,this->m_end);
  std::operator+(&local_e0,"Can\'t parse \'",&local_100);
  std::operator+(&local_c0,&local_e0,"\' as numeric type \'");
  std::operator+(&local_a0,&local_c0,___cxa_end_catch + (*___cxa_end_catch == '*'));
  std::operator+(&local_80,&local_a0,"\' - ");
  std::operator+(&local_60,&local_80,message);
  std::operator+(&local_40,&local_60,".");
  std::domain_error::domain_error(this_00,(string *)&local_40);
  __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

void throw_if(bool cond, const T&, const char* message) const
        {
            if(cond) {
                throw std::domain_error(
                    "Can't parse '" 
                  + std::string(m_beg, size_t(m_end-m_beg))
                  + "' as numeric type '" + typeid(T).name() 
                  + "' - " + message + ".");
            }
        }